

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int discard_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  int iVar1;
  uint bytes_00;
  
  iVar1 = 0;
  if (bytes != 0) {
    if ((ctx->field_0xcc & 1) == 0) {
      iVar1 = read_chunk_bytes(ctx,bytes);
      if (iVar1 == 0) {
LAB_001036a3:
        iVar1 = 0;
      }
    }
    else {
      do {
        if (bytes == 0) goto LAB_001036a3;
        bytes_00 = bytes;
        if (0x1fff < bytes) {
          bytes_00 = 0x2000;
        }
        iVar1 = read_chunk_bytes(ctx,bytes_00);
        if (iVar1 != 0) {
          bytes_00 = 0;
        }
        bytes = bytes - bytes_00;
      } while (iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

static int discard_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    int ret;

    if(ctx->streaming) /* Do small, consecutive reads */
    {
        while(bytes)
        {
            uint32_t len = SPNG_READ_SIZE;

            if(len > bytes) len = bytes;

            ret = read_chunk_bytes(ctx, len);
            if(ret) return ret;

            bytes -= len;
        }
    }
    else
    {
        ret = read_chunk_bytes(ctx, bytes);
        if(ret) return ret;
    }

    return 0;
}